

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthesis.cpp
# Opt level: O0

void anon_unknown.dwarf_7ad8::GetSpectrumWithFractionalTimeShift
               (int fft_size,double coefficient,InverseRealFFT *inverse_real_fft)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int local_44;
  int i;
  double im2;
  double re2;
  double im;
  double re;
  InverseRealFFT *inverse_real_fft_local;
  double coefficient_local;
  int fft_size_local;
  
  for (local_44 = 0; local_44 <= fft_size / 2; local_44 = local_44 + 1) {
    dVar1 = inverse_real_fft->spectrum[local_44][0];
    dVar2 = inverse_real_fft->spectrum[local_44][1];
    dVar3 = cos(coefficient * (double)local_44);
    dVar4 = sqrt(-dVar3 * dVar3 + 1.0);
    inverse_real_fft->spectrum[local_44][0] = dVar1 * dVar3 + dVar2 * dVar4;
    inverse_real_fft->spectrum[local_44][1] = dVar2 * dVar3 + -(dVar1 * dVar4);
  }
  return;
}

Assistant:

static void GetSpectrumWithFractionalTimeShift(int fft_size,
    double coefficient, const InverseRealFFT *inverse_real_fft) {
  double re, im, re2, im2;
  for (int i = 0; i <= fft_size / 2; ++i) {
    re = inverse_real_fft->spectrum[i][0];
    im = inverse_real_fft->spectrum[i][1];
    re2 = cos(coefficient * i);
    im2 = sqrt(1.0 - re2 * re2);  // sin(pshift)

    inverse_real_fft->spectrum[i][0] = re * re2 + im * im2;
    inverse_real_fft->spectrum[i][1] = im * re2 - re * im2;
  }
}